

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlottie.h
# Opt level: O2

void __thiscall GifBuilder::argbTorgba(GifBuilder *this,Surface *s)

{
  char *pcVar1;
  byte bVar2;
  uint32_t *puVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  char cVar7;
  char cVar8;
  float fVar9;
  
  puVar3 = s->mBuffer;
  sVar4 = s->mBytesPerLine;
  sVar5 = s->mHeight;
  for (uVar6 = 0; uVar6 < (uint)((int)sVar4 * (int)sVar5); uVar6 = uVar6 + 4) {
    bVar2 = *(byte *)((long)puVar3 + uVar6 + 3);
    if (bVar2 == 0) {
      *(uint8_t *)((long)puVar3 + uVar6 + 2) = this->bgColorB;
      *(uint8_t *)((long)puVar3 + uVar6 + 1) = this->bgColorG;
      *(uint8_t *)((long)puVar3 + uVar6) = this->bgColorR;
    }
    else {
      cVar7 = *(char *)((long)puVar3 + uVar6);
      cVar8 = *(char *)((long)puVar3 + uVar6 + 2);
      if (bVar2 != 0xff) {
        fVar9 = (float)(byte)~bVar2 / 255.0;
        bVar2 = this->bgColorB;
        cVar8 = cVar8 + (char)(int)((float)this->bgColorR * fVar9);
        pcVar1 = (char *)((long)puVar3 + uVar6 + 1);
        *pcVar1 = *pcVar1 + (char)(int)((float)this->bgColorG * fVar9);
        cVar7 = cVar7 + (char)(int)((float)bVar2 * fVar9);
      }
      *(char *)((long)puVar3 + uVar6) = cVar8;
      *(char *)((long)puVar3 + uVar6 + 2) = cVar7;
    }
  }
  return;
}

Assistant:

uint32_t *buffer() const {return mBuffer;}